

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O1

void __thiscall
Formula_Context::Note_Changed(Formula_Context *this,Am_Object_Advanced *object,Am_Slot_Key key)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Object local_30;
  
  Am_Slot::Get_Owner((Am_Slot *)&local_30);
  bVar1 = Am_Object::operator==(&object->super_Am_Object,&local_30);
  if (bVar1) {
    AVar2 = Am_Slot::Get_Key(&this->depender);
    Am_Object::~Am_Object(&local_30);
    if (AVar2 == key) {
      this->changed = true;
      return;
    }
  }
  else {
    Am_Object::~Am_Object(&local_30);
  }
  (*Am_Empty_Constraint_Context->_vptr_Am_Constraint_Context[3])
            (Am_Empty_Constraint_Context,object,(ulong)key);
  return;
}

Assistant:

void
Formula_Context::Note_Changed(const Am_Object_Advanced &object, Am_Slot_Key key)
{
  if ((object == depender.Get_Owner()) && (key == depender.Get_Key()))
    changed = true;
  else
    Am_Empty_Constraint_Context->Note_Changed(object, key);
}